

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

optional<long_long> __thiscall
QXmlStreamReaderPrivate::fastScanName(QXmlStreamReaderPrivate *this,Value *val)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  _Storage<long_long,_true> _Var5;
  ulong uVar6;
  uint uVar7;
  QStringView s;
  optional<long_long> oVar8;
  
  _Var5._M_value = 0;
LAB_0039b694:
  lVar3 = (this->putStack).tos;
  if (lVar3 != -1) {
    if (this->atEnd == false) {
      uVar7 = (this->putStack).data[lVar3];
      (this->putStack).tos = lVar3 + -1;
      goto LAB_0039b6fa;
    }
LAB_0039b85a:
    if (val != (Value *)0x0) {
      val->prefix = 0;
    }
    lVar3 = (this->textBuffer).d.size;
    lVar4 = lVar3 - (long)_Var5;
    s.m_data = (this->textBuffer).d.ptr;
    s.m_size = lVar3;
    putString(this,s,lVar4);
    QString::resize(&this->textBuffer,lVar4);
    uVar6 = 0xf8009fef00002601;
    _Var5._M_value = 0;
    goto LAB_0039b909;
  }
  lVar3 = this->readBufferPos;
  if (lVar3 < (this->readBuffer).d.size) {
    this->readBufferPos = lVar3 + 1;
    uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar3];
  }
  else {
    uVar7 = getChar_helper(this);
LAB_0039b6fa:
    if (uVar7 == 0xffffffff) goto LAB_0039b85a;
  }
  if (_Var5._M_value == 0x1000) {
    raiseNamePrefixTooLongError(this);
    uVar6 = 0;
    goto LAB_0039b909;
  }
  if (0x3f < uVar7) {
LAB_0039b726:
    if ((uVar7 - 0x5b < 0x22) && ((0x20000000dU >> ((ulong)(uVar7 - 0x5b) & 0x3f) & 1) != 0))
    goto LAB_0039b771;
LAB_0039b75e:
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar7);
    _Var5._M_value = _Var5._M_value + 1;
    goto LAB_0039b694;
  }
  if ((ulong)uVar7 == 0x3a) {
    if ((val == (Value *)0x0) || (val->prefix != 0)) {
      puVar2 = (this->putStack).data;
      lVar4 = (this->putStack).tos;
      lVar3 = lVar4 + 1;
      lVar1 = (this->putStack).cap;
      if (lVar1 <= lVar3) {
        lVar4 = lVar4 + 2;
        lVar3 = lVar1 * 2;
        if (lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + lVar1 * -2 < 0) {
          lVar3 = lVar4;
        }
        (this->putStack).cap = lVar3;
        puVar2 = (uint *)realloc(puVar2,lVar3 << 2);
        (this->putStack).data = puVar2;
        if (puVar2 == (uint *)0x0) goto LAB_0039b91d;
        lVar3 = (this->putStack).tos + 1;
      }
      (this->putStack).tos = lVar3;
      puVar2[lVar3] = 0x3a;
      uVar6 = 0xf8009fef00002601;
      goto LAB_0039b909;
    }
    val->prefix = (short)_Var5._M_value + 2;
    goto LAB_0039b75e;
  }
  if ((0xf8009fef00002600U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_0039b726;
LAB_0039b771:
  puVar2 = (this->putStack).data;
  lVar4 = (this->putStack).tos;
  lVar3 = lVar4 + 1;
  lVar1 = (this->putStack).cap;
  if (lVar1 <= lVar3) {
    lVar4 = lVar4 + 2;
    lVar3 = lVar1 * 2;
    if (lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + lVar1 * -2 < 0) {
      lVar3 = lVar4;
    }
    (this->putStack).cap = lVar3;
    puVar2 = (uint *)realloc(puVar2,lVar3 << 2);
    (this->putStack).data = puVar2;
    if (puVar2 == (uint *)0x0) goto LAB_0039b91d;
    lVar3 = (this->putStack).tos + 1;
  }
  (this->putStack).tos = lVar3;
  puVar2[lVar3] = uVar7;
  uVar6 = 0xf8009fef00002601;
  if ((val != (Value *)0x0) && ((long)val->prefix + -1 == _Var5._M_value)) {
    val->prefix = 0;
    lVar4 = lVar3 + 1;
    lVar1 = (this->putStack).cap;
    if (lVar1 <= lVar4) {
      lVar3 = lVar3 + 2;
      lVar4 = lVar1 * 2;
      if (lVar3 != lVar4 && SBORROW8(lVar3,lVar4) == lVar3 + lVar1 * -2 < 0) {
        lVar4 = lVar3;
      }
      (this->putStack).cap = lVar4;
      puVar2 = (uint *)realloc(puVar2,lVar4 << 2);
      (this->putStack).data = puVar2;
      if (puVar2 == (uint *)0x0) {
LAB_0039b91d:
        qBadAlloc();
      }
      lVar4 = (this->putStack).tos + 1;
    }
    (this->putStack).tos = lVar4;
    puVar2[lVar4] = 0x3a;
    _Var5._M_value = _Var5._M_value + -1;
  }
LAB_0039b909:
  oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = uVar6 & 0xffffffff;
  oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = _Var5._M_value;
  return (optional<long_long>)
         oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

inline std::optional<qsizetype> QXmlStreamReaderPrivate::fastScanName(Value *val)
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (n >= 4096) {
            // This is too long to be a sensible name, and
            // can exhaust memory, or the range of decltype(*prefix)
            raiseNamePrefixTooLongError();
            return std::nullopt;
        }
        switch (c) {
        case '\n':
        case ' ':
        case '\t':
        case '\r':
        case '&':
        case '#':
        case '\'':
        case '\"':
        case '<':
        case '>':
        case '[':
        case ']':
        case '=':
        case '%':
        case '/':
        case ';':
        case '?':
        case '!':
        case '^':
        case '|':
        case ',':
        case '(':
        case ')':
        case '+':
        case '*':
            putChar(c);
            if (val && val->prefix == n + 1) {
                val->prefix = 0;
                putChar(':');
                --n;
            }
            return n;
        case ':':
            if (val) {
                if (val->prefix == 0) {
                    val->prefix = qint16(n + 2);
                } else { // only one colon allowed according to the namespace spec.
                    putChar(c);
                    return n;
                }
            } else {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }

    if (val)
        val->prefix = 0;
    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    return 0;
}